

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

bool __thiscall nivalis::util::is_varname(util *this,string_view expr)

{
  byte bVar1;
  util *puVar2;
  bool bVar3;
  bool bVar4;
  
  bVar1 = *(byte *)expr._M_len;
  if ((((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) || (bVar1 == 0x5f)) || (bVar1 == 0x27)) {
    bVar3 = this < (util *)0x2;
    if (!bVar3) {
      puVar2 = (util *)0x2;
      do {
        bVar1 = ((byte *)expr._M_len + -1)[(long)puVar2];
        if (((0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) &&
            ((0x3c < bVar1 - 0x24 ||
             ((0x1800000010000009U >> ((ulong)(bVar1 - 0x24) & 0x3f) & 1) == 0)))) &&
           (bVar1 != 0x2e && 9 < (byte)(bVar1 - 0x30))) {
          return bVar3;
        }
        bVar3 = this <= puVar2;
        bVar4 = puVar2 != this;
        puVar2 = puVar2 + 1;
      } while (bVar4);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool is_varname(std::string_view expr) {
    if(!util::is_varname_first(expr[0])) return false;
    for (size_t k = 1; k < expr.size(); ++k) {
        if (!util::is_identifier(expr[k])) return false;
    }
    return true;
}